

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O3

cubeb_resampler *
cubeb_resampler_create_internal<short>
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  cubeb_resampler_speex_one_way<short> *this;
  cubeb_resampler_speex_one_way<short> *this_00;
  delay_line<short> *pdVar5;
  passthrough_resampler<short> *this_01;
  cubeb_data_callback p_Var6;
  code *pcVar7;
  uint32_t uVar8;
  uint source_rate;
  delay_line<short> *local_48;
  delay_line<short> *local_40;
  cubeb_stream *local_38;
  
  local_40 = (delay_line<short> *)0x0;
  local_48 = (delay_line<short> *)0x0;
  local_38 = stream;
  if (input_params == (cubeb_stream_params *)0x0) {
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_00123685;
    pdVar5 = (delay_line<short> *)0x0;
    this = (cubeb_resampler_speex_one_way<short> *)0x0;
LAB_001238ab:
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Resampling output (%dHz) to target and input rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x259,(ulong)output_params->rate,(ulong)target_rate);
      pdVar5 = local_40;
    }
    this_01 = (passthrough_resampler<short> *)operator_new(0x48);
    local_40 = (delay_line<short> *)0x0;
    (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0015b178;
    *(delay_line<short> **)&this_01->super_processor = pdVar5;
    this_01->stream = (cubeb_stream *)this;
    (this_01->internal_input_buffer).data_ = (short *)local_38;
    (this_01->internal_input_buffer).capacity_ = (size_t)callback;
    (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
    *(undefined1 *)&this_01->sample_rate = 0;
    if (this == (cubeb_resampler_speex_one_way<short> *)0x0 && pdVar5 == (delay_line<short> *)0x0)
    goto LAB_00123ab2;
    pcVar7 = cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
             ::fill_internal_duplex;
    if (pdVar5 == (delay_line<short> *)0x0) {
      pcVar7 = cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
               ::fill_internal_input;
    }
    if (this == (cubeb_resampler_speex_one_way<short> *)0x0) {
      pcVar7 = cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
               ::fill_internal_input;
    }
    p_Var6 = cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
             ::fill_internal_output;
    if (pdVar5 != (delay_line<short> *)0x0) {
      p_Var6 = pcVar7;
    }
    this_01->data_callback = p_Var6;
  }
  else {
    source_rate = input_params->rate;
    if (output_params != (cubeb_stream_params *)0x0 && source_rate == target_rate) {
LAB_00123685:
      if (output_params->rate == target_rate) {
LAB_0012368b:
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Input and output sample-rate match, target rate of %dHz\n",
                     "cubeb_resampler_internal.h",0x216,(ulong)target_rate);
        }
        this_01 = (passthrough_resampler<short> *)operator_new(0x48);
        if (input_params == (cubeb_stream_params *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = input_params->channels;
        }
        passthrough_resampler<short>::passthrough_resampler
                  (this_01,local_38,callback,user_ptr,uVar8,target_rate);
        goto LAB_00123ab2;
      }
LAB_001236e0:
      uVar8 = output_params->rate;
      if (uVar8 == target_rate) {
        this = (cubeb_resampler_speex_one_way<short> *)0x0;
      }
      else {
        this = (cubeb_resampler_speex_one_way<short> *)operator_new(0x58);
        iVar3 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar3 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
                  (this,output_params->channels,target_rate,uVar8,iVar3);
      }
      if (input_params != (cubeb_stream_params *)0x0) {
        source_rate = input_params->rate;
        bVar2 = true;
        goto LAB_00123742;
      }
      bVar2 = true;
LAB_00123800:
      if (this == (cubeb_resampler_speex_one_way<short> *)0x0) {
        pdVar5 = (delay_line<short> *)0x0;
        this = (cubeb_resampler_speex_one_way<short> *)0x0;
      }
      else if (bVar2 && input_params != (cubeb_stream_params *)0x0) {
        pdVar5 = (delay_line<short> *)operator_new(0x48);
        iVar3 = speex_resampler_get_output_latency(this->speex_resampler);
        uVar4 = iVar3 + this->additional_latency;
        uVar8 = input_params->channels;
        uVar1 = output_params->rate;
        (pdVar5->super_processor).channels = uVar8;
        pdVar5->length = uVar4;
        pdVar5->leftover_samples = 0;
        (pdVar5->delay_output_buffer).capacity_ = 0;
        (pdVar5->delay_output_buffer).length_ = 0;
        (pdVar5->delay_input_buffer).length_ = 0;
        (pdVar5->delay_output_buffer).data_ = (short *)0x0;
        (pdVar5->delay_input_buffer).data_ = (short *)0x0;
        (pdVar5->delay_input_buffer).capacity_ = 0;
        pdVar5->sample_rate = uVar1;
        auto_array<short>::push_silence(&pdVar5->delay_input_buffer,(ulong)(uVar8 * uVar4));
        local_40 = pdVar5;
      }
      else {
        pdVar5 = (delay_line<short> *)0x0;
      }
      goto LAB_001238ab;
    }
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_001236e0;
    if (source_rate == target_rate) goto LAB_0012368b;
    this = (cubeb_resampler_speex_one_way<short> *)0x0;
    bVar2 = false;
LAB_00123742:
    if (source_rate == target_rate) goto LAB_00123800;
    this_00 = (cubeb_resampler_speex_one_way<short> *)operator_new(0x58);
    iVar3 = -1;
    if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
      iVar3 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
    }
    cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
              (this_00,input_params->channels,source_rate,target_rate,iVar3);
    if ((bool)(bVar2 & input_params != (cubeb_stream_params *)0x0 &
              this == (cubeb_resampler_speex_one_way<short> *)0x0)) {
      pdVar5 = (delay_line<short> *)operator_new(0x48);
      iVar3 = speex_resampler_get_output_latency(this_00->speex_resampler);
      uVar4 = iVar3 + this_00->additional_latency;
      uVar8 = output_params->rate;
      uVar1 = output_params->channels;
      (pdVar5->super_processor).channels = uVar1;
      pdVar5->length = uVar4;
      pdVar5->leftover_samples = 0;
      (pdVar5->delay_output_buffer).capacity_ = 0;
      (pdVar5->delay_output_buffer).length_ = 0;
      (pdVar5->delay_input_buffer).length_ = 0;
      (pdVar5->delay_output_buffer).data_ = (short *)0x0;
      (pdVar5->delay_input_buffer).data_ = (short *)0x0;
      (pdVar5->delay_input_buffer).capacity_ = 0;
      pdVar5->sample_rate = uVar8;
      auto_array<short>::push_silence(&pdVar5->delay_input_buffer,(ulong)(uVar1 * uVar4));
      local_48 = pdVar5;
LAB_00123a11:
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) to target and output rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x251,(ulong)input_params->rate,(ulong)target_rate);
        pdVar5 = local_48;
      }
      this_01 = (passthrough_resampler<short> *)operator_new(0x48);
      local_48 = (delay_line<short> *)0x0;
      (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0015b148;
      *(cubeb_resampler_speex_one_way<short> **)&this_01->super_processor = this_00;
      this_01->stream = (cubeb_stream *)pdVar5;
      (this_01->internal_input_buffer).data_ = (short *)local_38;
      (this_01->internal_input_buffer).capacity_ = (size_t)callback;
      (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
      *(undefined1 *)&this_01->sample_rate = 0;
      pcVar7 = cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
               ::fill_internal_duplex;
      if (pdVar5 == (delay_line<short> *)0x0) {
        pcVar7 = cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
                 ::fill_internal_input;
      }
      this_01->data_callback = pcVar7;
      this_01->user_ptr = (void *)0x0;
      goto LAB_00123ab2;
    }
    if (this == (cubeb_resampler_speex_one_way<short> *)0x0) {
      pdVar5 = (delay_line<short> *)0x0;
      goto LAB_00123a11;
    }
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Resampling input (%d) and output (%d) to target rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x249,(ulong)input_params->rate,
                 (ulong)output_params->rate,(ulong)target_rate);
    }
    this_01 = (passthrough_resampler<short> *)operator_new(0x48);
    (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0015b118;
    *(cubeb_resampler_speex_one_way<short> **)&this_01->super_processor = this_00;
    this_01->stream = (cubeb_stream *)this;
    (this_01->internal_input_buffer).data_ = (short *)local_38;
    (this_01->internal_input_buffer).capacity_ = (size_t)callback;
    (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
    *(undefined1 *)&this_01->sample_rate = 0;
    this_01->data_callback =
         cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
         ::fill_internal_duplex;
  }
  this_01->user_ptr = (void *)0x0;
LAB_00123ab2:
  if (local_48 != (delay_line<short> *)0x0) {
    std::default_delete<delay_line<short>_>::operator()
              ((default_delete<delay_line<short>_> *)&local_48,local_48);
  }
  if (local_40 != (delay_line<short> *)0x0) {
    std::default_delete<delay_line<short>_>::operator()
              ((default_delete<delay_line<short>_> *)&local_40,local_40);
  }
  return &this_01->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create_internal(cubeb_stream * stream,
                                cubeb_stream_params * input_params,
                                cubeb_stream_params * output_params,
                                unsigned int target_rate,
                                cubeb_data_callback callback,
                                void * user_ptr,
                                cubeb_resampler_quality quality)
{
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> input_resampler = nullptr;
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> output_resampler = nullptr;
  std::unique_ptr<delay_line<T>> input_delay = nullptr;
  std::unique_ptr<delay_line<T>> output_delay = nullptr;

  assert((input_params || output_params) &&
         "need at least one valid parameter pointer.");

  /* All the streams we have have a sample rate that matches the target
     sample rate, use a no-op resampler, that simply forwards the buffers to the
     callback. */
  if (((input_params && input_params->rate == target_rate) &&
      (output_params && output_params->rate == target_rate)) ||
      (input_params && !output_params && (input_params->rate == target_rate)) ||
      (output_params && !input_params && (output_params->rate == target_rate))) {
    LOG("Input and output sample-rate match, target rate of %dHz", target_rate);
    return new passthrough_resampler<T>(stream, callback,
                                        user_ptr,
                                        input_params ? input_params->channels : 0,
                                        target_rate);
  }

  /* Determine if we need to resampler one or both directions, and create the
     resamplers. */
  if (output_params && (output_params->rate != target_rate)) {
    output_resampler.reset(
        new cubeb_resampler_speex_one_way<T>(output_params->channels,
                                             target_rate,
                                             output_params->rate,
                                             to_speex_quality(quality)));
    if (!output_resampler) {
      return NULL;
    }
  }

  if (input_params && (input_params->rate != target_rate)) {
    input_resampler.reset(
        new cubeb_resampler_speex_one_way<T>(input_params->channels,
                                             input_params->rate,
                                             target_rate,
                                             to_speex_quality(quality)));
    if (!input_resampler) {
      return NULL;
    }
  }

  /* If we resample only one direction but we have a duplex stream, insert a
   * delay line with a length equal to the resampler latency of the
   * other direction so that the streams are synchronized. */
  if (input_resampler && !output_resampler && input_params && output_params) {
    output_delay.reset(new delay_line<T>(input_resampler->latency(),
                                         output_params->channels,
                                         output_params->rate));
    if (!output_delay) {
      return NULL;
    }
  } else if (output_resampler && !input_resampler && input_params && output_params) {
    input_delay.reset(new delay_line<T>(output_resampler->latency(),
                                        input_params->channels,
                                        output_params->rate));
    if (!input_delay) {
      return NULL;
    }
  }

  if (input_resampler && output_resampler) {
    LOG("Resampling input (%d) and output (%d) to target rate of %dHz", input_params->rate, output_params->rate, target_rate);
    return new cubeb_resampler_speex<T,
                                     cubeb_resampler_speex_one_way<T>,
                                     cubeb_resampler_speex_one_way<T>>
                                       (input_resampler.release(),
                                        output_resampler.release(),
                                        stream, callback, user_ptr);
  } else if (input_resampler) {
    LOG("Resampling input (%d) to target and output rate of %dHz", input_params->rate, target_rate);
    return new cubeb_resampler_speex<T,
                                     cubeb_resampler_speex_one_way<T>,
                                     delay_line<T>>
                                      (input_resampler.release(),
                                       output_delay.release(),
                                       stream, callback, user_ptr);
  } else {
    LOG("Resampling output (%dHz) to target and input rate of %dHz", output_params->rate, target_rate);
    return new cubeb_resampler_speex<T,
                                     delay_line<T>,
                                     cubeb_resampler_speex_one_way<T>>
                                      (input_delay.release(),
                                       output_resampler.release(),
                                       stream, callback, user_ptr);
  }
}